

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Difference>::reset
          (IdBlockBase<mathiu::impl::Difference> *this,int32_t depth)

{
  variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_40;
  int32_t local_14;
  IdBlockBase<mathiu::impl::Difference> *pIStack_10;
  int32_t depth_local;
  IdBlockBase<mathiu::impl::Difference> *this_local;
  
  if (-1 < this->mDepth - depth) {
    local_14 = depth;
    pIStack_10 = this;
    memset(&local_40,0,0x28);
    std::
    variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::variant(&local_40);
    std::
    variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::operator=(&this->mVariant,&local_40);
    std::
    variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::~variant(&local_40);
    this->mDepth = local_14;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }